

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printRotImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  int iVar2;
  MCOperand *op;
  int64_t iVar3;
  uint in_ESI;
  MCInst *in_RDI;
  uint Imm;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar3 = MCOperand_getImm(op);
  iVar2 = (int)iVar3;
  if (iVar2 == 0) {
    return;
  }
  SStream_concat0((SStream *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  if (iVar2 != 1) {
    if (iVar2 == 2) {
      SStream_concat0((SStream *)0x200000002,in_stack_ffffffffffffffd8);
      goto LAB_002bc8e7;
    }
    if (iVar2 == 3) {
      SStream_concat0((SStream *)0x300000003,in_stack_ffffffffffffffd8);
      goto LAB_002bc8e7;
    }
  }
  SStream_concat0((SStream *)CONCAT44(iVar2,iVar2),in_stack_ffffffffffffffd8);
LAB_002bc8e7:
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x39;
    puVar1[0] = '\x04';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(int *)(in_RDI->flat_insn->detail->groups +
            (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x3d) =
         iVar2 << 3;
  }
  return;
}

Assistant:

static void printRotImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Imm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	if (Imm == 0)
		return;
	SStream_concat0(O, ", ror #");
	switch (Imm) {
		default: //assert (0 && "illegal ror immediate!");
		case 1: SStream_concat0(O, "8"); break;
		case 2: SStream_concat0(O, "16"); break;
		case 3: SStream_concat0(O, "24"); break;
	}
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_ROR;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = Imm * 8;
	}
}